

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corunix.hpp
# Opt level: O0

void __thiscall
CorUnix::CObjectType::CObjectType
          (CObjectType *this,PalObjectTypeId eTypeId,OBJECTCLEANUPROUTINE pCleanupRoutine,
          OBJECTINITROUTINE pInitRoutine,DWORD dwImmutableDataSize,DWORD dwProcessLocalDataSize,
          DWORD dwSharedDataSize,DWORD dwSupportedAccessRights,SecuritySupport eSecuritySupport,
          SecurityPersistence eSecurityPersistence,ObjectNameSupport eObjectNameSupport,
          HandleDuplicationSupport eHandleDuplicationSupport,
          SynchronizationSupport eSynchronizationSupport,SignalingSemantics eSignalingSemantics,
          ThreadReleaseSemantics eThreadReleaseSemantics,OwnershipSemantics eOwnershipSemantics)

{
  DWORD dwProcessLocalDataSize_local;
  DWORD dwImmutableDataSize_local;
  OBJECTINITROUTINE pInitRoutine_local;
  OBJECTCLEANUPROUTINE pCleanupRoutine_local;
  PalObjectTypeId eTypeId_local;
  CObjectType *this_local;
  
  this->m_eTypeId = eTypeId;
  this->m_pCleanupRoutine = pCleanupRoutine;
  this->m_pInitRoutine = pInitRoutine;
  this->m_dwImmutableDataSize = dwImmutableDataSize;
  this->m_dwProcessLocalDataSize = dwProcessLocalDataSize;
  this->m_dwSharedDataSize = dwSharedDataSize;
  this->m_dwSupportedAccessRights = dwSupportedAccessRights;
  this->m_eSecuritySupport = eSecuritySupport;
  this->m_eSecurityPersistence = eSecurityPersistence;
  this->m_eObjectNameSupport = eObjectNameSupport;
  this->m_eHandleDuplicationSupport = eHandleDuplicationSupport;
  this->m_eSynchronizationSupport = eSynchronizationSupport;
  this->m_eSignalingSemantics = eSignalingSemantics;
  this->m_eThreadReleaseSemantics = eThreadReleaseSemantics;
  this->m_eOwnershipSemantics = eOwnershipSemantics;
  s_rgotIdMapping[eTypeId] = this;
  return;
}

Assistant:

CObjectType(
            PalObjectTypeId eTypeId,
            OBJECTCLEANUPROUTINE pCleanupRoutine,
            OBJECTINITROUTINE pInitRoutine,
            DWORD dwImmutableDataSize,
            DWORD dwProcessLocalDataSize,
            DWORD dwSharedDataSize,
            DWORD dwSupportedAccessRights,
            SecuritySupport eSecuritySupport,
            SecurityPersistence eSecurityPersistence,
            ObjectNameSupport eObjectNameSupport,
            HandleDuplicationSupport eHandleDuplicationSupport,
            SynchronizationSupport eSynchronizationSupport,
            SignalingSemantics eSignalingSemantics,
            ThreadReleaseSemantics eThreadReleaseSemantics,
            OwnershipSemantics eOwnershipSemantics
            )
            :
            m_eTypeId(eTypeId),
            m_pCleanupRoutine(pCleanupRoutine),
            m_pInitRoutine(pInitRoutine),
            m_dwImmutableDataSize(dwImmutableDataSize),
            m_dwProcessLocalDataSize(dwProcessLocalDataSize),
            m_dwSharedDataSize(dwSharedDataSize),
            m_dwSupportedAccessRights(dwSupportedAccessRights),
            m_eSecuritySupport(eSecuritySupport),
            m_eSecurityPersistence(eSecurityPersistence),
            m_eObjectNameSupport(eObjectNameSupport),
            m_eHandleDuplicationSupport(eHandleDuplicationSupport),
            m_eSynchronizationSupport(eSynchronizationSupport),
            m_eSignalingSemantics(eSignalingSemantics),
            m_eThreadReleaseSemantics(eThreadReleaseSemantics),
            m_eOwnershipSemantics(eOwnershipSemantics)
        {
            s_rgotIdMapping[eTypeId] = this;
        }